

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O0

Diagnostics * __thiscall
slang::DiagnosticEngine::setMappingsFromPragmas(DiagnosticEngine *this,BufferID buffer)

{
  bool bVar1;
  undefined4 in_EDX;
  Diagnostics *in_RDI;
  span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL> directives;
  Diagnostics *diags;
  Diagnostics *in_stack_000002f0;
  DiagnosticEngine *in_stack_000002f8;
  span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>
  in_stack_00000300;
  BufferID in_stack_00000314;
  undefined4 in_stack_ffffffffffffffc8;
  undefined8 in_stack_ffffffffffffffd0;
  BufferID buffer_00;
  
  buffer_00.id = (uint32_t)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  Diagnostics::Diagnostics((Diagnostics *)0x530d49);
  SourceManager::getDiagnosticDirectives
            ((SourceManager *)CONCAT44(in_EDX,in_stack_ffffffffffffffc8),buffer_00);
  bVar1 = std::span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL>::
          empty((span<const_slang::SourceManager::DiagnosticDirectiveInfo,_18446744073709551615UL> *
                )0x530d8c);
  if (!bVar1) {
    setMappingsFromPragmasImpl<slang::SourceManager::DiagnosticDirectiveInfo>
              (in_stack_000002f8,in_stack_00000314,in_stack_00000300,in_stack_000002f0);
  }
  return in_RDI;
}

Assistant:

Diagnostics DiagnosticEngine::setMappingsFromPragmas(BufferID buffer) {
    Diagnostics diags;
    auto directives = sourceManager.getDiagnosticDirectives(buffer);
    if (!directives.empty()) {
        setMappingsFromPragmasImpl<SourceManager::DiagnosticDirectiveInfo>(buffer, directives,
                                                                           diags);
    }

    return diags;
}